

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::Grouper::setLocaleData
          (Grouper *this,ParsedPatternInfo *patternInfo,Locale *locale)

{
  uint64_t uVar1;
  int16_t iVar2;
  int32_t iVar3;
  short sVar4;
  short sVar5;
  
  if ((this->fGrouping1 != -2) && (this->fGrouping2 != -4)) {
    return;
  }
  uVar1 = (patternInfo->positive).groupingSizes;
  sVar4 = (ushort)(this->fGrouping1 == -4) * 4 + -1;
  if (((uint)(uVar1 >> 0x10) & 0xffff) != 0xffff) {
    sVar4 = (short)uVar1;
  }
  sVar5 = sVar4;
  if ((short)(uVar1 >> 0x20) != -1) {
    sVar5 = (short)(uVar1 >> 0x10);
  }
  if (this->fMinGrouping == -3) {
    iVar2 = anon_unknown.dwarf_18718c::getMinGroupingForLocale((Locale *)locale->fullName);
    iVar3 = uprv_max_63(2,(int)iVar2);
    iVar2 = (int16_t)iVar3;
  }
  else {
    if (this->fMinGrouping != -2) goto LAB_0026a8d0;
    iVar2 = anon_unknown.dwarf_18718c::getMinGroupingForLocale((Locale *)locale->fullName);
  }
  this->fMinGrouping = iVar2;
LAB_0026a8d0:
  this->fGrouping1 = sVar4;
  this->fGrouping2 = sVar5;
  return;
}

Assistant:

void Grouper::setLocaleData(const impl::ParsedPatternInfo &patternInfo, const Locale& locale) {
    if (fGrouping1 != -2 && fGrouping2 != -4) {
        return;
    }
    auto grouping1 = static_cast<int16_t> (patternInfo.positive.groupingSizes & 0xffff);
    auto grouping2 = static_cast<int16_t> ((patternInfo.positive.groupingSizes >> 16) & 0xffff);
    auto grouping3 = static_cast<int16_t> ((patternInfo.positive.groupingSizes >> 32) & 0xffff);
    if (grouping2 == -1) {
        grouping1 = fGrouping1 == -4 ? (short) 3 : (short) -1;
    }
    if (grouping3 == -1) {
        grouping2 = grouping1;
    }
    if (fMinGrouping == -2) {
        fMinGrouping = getMinGroupingForLocale(locale);
    } else if (fMinGrouping == -3) {
        fMinGrouping = static_cast<int16_t>(uprv_max(2, getMinGroupingForLocale(locale)));
    } else {
        // leave fMinGrouping alone
    }
    fGrouping1 = grouping1;
    fGrouping2 = grouping2;
}